

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::Filter::setOperator(Filter *this,shared_ptr<helics::FilterOperator> *filterOp)

{
  uint uVar1;
  Core *pCVar2;
  undefined4 local_28;
  undefined4 uStack_24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  pCVar2 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  local_28 = *(undefined4 *)
              &(filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  uStack_24 = *(undefined4 *)
               ((long)&(filterOp->
                       super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 4);
  a_Stack_20[0]._M_pi._0_4_ =
       *(undefined4 *)
        &(filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  a_Stack_20[0]._M_pi._4_4_ =
       *(undefined4 *)
        ((long)&(filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi + 4);
  (filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (*pCVar2->_vptr_Core[0x54])(pCVar2,(ulong)uVar1,&local_28);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  return;
}

Assistant:

void Filter::setOperator(std::shared_ptr<FilterOperator> filterOp)
{
    mCore->setFilterOperator(handle, std::move(filterOp));
}